

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::OnStyleSheetChangeRecursive(Element *this)

{
  int iVar1;
  Element *this_00;
  int local_18;
  int i;
  int num_children;
  Element *this_local;
  
  ElementEffects::DirtyEffects(&this->meta->effects);
  (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xf])();
  iVar1 = GetNumChildren(this,true);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    this_00 = GetChild(this,local_18);
    OnStyleSheetChangeRecursive(this_00);
  }
  return;
}

Assistant:

void Element::OnStyleSheetChangeRecursive()
{
	meta->effects.DirtyEffects();

	OnStyleSheetChange();

	// Now dirty all of our descendants.
	const int num_children = GetNumChildren(true);
	for (int i = 0; i < num_children; ++i)
		GetChild(i)->OnStyleSheetChangeRecursive();
}